

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

uint If_DsdManCheckAndXor
               (If_DsdMan_t *p,int iFirst,uint uMaskNot,If_DsdObj_t *pObj,int nSuppAll,int LutSize,
               int fDerive,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int local_c8;
  uint uRes;
  int pFirsts [12];
  int local_88;
  int nFans;
  int pSSizes [12];
  int SizeOut;
  int SizeIn;
  int LimitOut;
  int i [6];
  int LutSize_local;
  int nSuppAll_local;
  If_DsdObj_t *pObj_local;
  uint uMaskNot_local;
  int iFirst_local;
  If_DsdMan_t *p_local;
  
  iVar1 = If_DsdObjFaninNum(pObj);
  if (*(uint *)&pObj->field_0x4 >> 0x1b < 3) {
    __assert_fail("pObj->nFans > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x6f6,
                  "unsigned int If_DsdManCheckAndXor(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  iVar2 = If_DsdObjSuppSize(pObj);
  if (iVar2 <= LutSize) {
    __assert_fail("If_DsdObjSuppSize(pObj) > LutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x6f7,
                  "unsigned int If_DsdManCheckAndXor(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  If_DsdManGetSuppSizes(p,pObj,&local_88);
  iVar2 = LutSize - ((nSuppAll - (*(uint *)&pObj->field_0x4 >> 3 & 0x1f)) + 1);
  if (LutSize <= iVar2) {
    __assert_fail("LimitOut < LutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x6fa,
                  "unsigned int If_DsdManCheckAndXor(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  for (SizeIn = 0; LimitOut = SizeIn, SizeIn < iVar1; SizeIn = SizeIn + 1) {
    while (LimitOut = LimitOut + 1, LimitOut < iVar1) {
      pSSizes[0xb] = (*(uint *)&pObj->field_0x4 >> 3 & 0x1f) -
                     ((&local_88)[SizeIn] + (&local_88)[LimitOut]);
      if (((&local_88)[SizeIn] + (&local_88)[LimitOut] <= LutSize) && (pSSizes[0xb] <= iVar2)) {
        if (fDerive == 0) {
          return 0xffffffff;
        }
        If_DsdManComputeFirst(p,pObj,&local_c8);
        uVar3 = If_DsdSign(p,pObj,SizeIn,iFirst + (&local_c8)[SizeIn],0);
        uVar4 = If_DsdSign(p,pObj,LimitOut,iFirst + (&local_c8)[LimitOut],0);
        if (((uVar3 | uVar4) & uMaskNot) == 0) {
          return uVar3 | uVar4;
        }
      }
    }
  }
  if (*(uint *)&pObj->field_0x4 >> 0x1b != 3) {
    for (SizeIn = 0; iVar5 = SizeIn, SizeIn < iVar1; SizeIn = SizeIn + 1) {
      while (LimitOut = iVar5 + 1, LimitOut < iVar1) {
        for (i[0] = iVar5 + 2; iVar5 = LimitOut, i[0] < iVar1; i[0] = i[0] + 1) {
          iVar5 = (&local_88)[SizeIn] + (&local_88)[LimitOut] + (&local_88)[i[0]];
          pSSizes[0xb] = (*(uint *)&pObj->field_0x4 >> 3 & 0x1f) - iVar5;
          if ((iVar5 <= LutSize) && (pSSizes[0xb] <= iVar2)) {
            if (fDerive == 0) {
              return 0xffffffff;
            }
            If_DsdManComputeFirst(p,pObj,&local_c8);
            uVar3 = If_DsdSign(p,pObj,SizeIn,iFirst + (&local_c8)[SizeIn],0);
            uVar4 = If_DsdSign(p,pObj,LimitOut,iFirst + (&local_c8)[LimitOut],0);
            uVar6 = If_DsdSign(p,pObj,i[0],iFirst + (&local_c8)[i[0]],0);
            uVar6 = uVar3 | uVar4 | uVar6;
            if ((uVar6 & uMaskNot) == 0) {
              return uVar6;
            }
          }
        }
      }
    }
    if (*(uint *)&pObj->field_0x4 >> 0x1b != 4) {
      for (SizeIn = 0; iVar5 = SizeIn, SizeIn < iVar1; SizeIn = SizeIn + 1) {
        while (LimitOut = iVar5 + 1, LimitOut < iVar1) {
          for (i[0] = iVar5 + 2; iVar5 = LimitOut, i[1] = i[0], i[0] < iVar1; i[0] = i[0] + 1) {
            while (i[1] = i[1] + 1, i[1] < iVar1) {
              iVar5 = (&local_88)[SizeIn] + (&local_88)[LimitOut] + (&local_88)[i[0]] +
                      (&local_88)[i[1]];
              pSSizes[0xb] = (*(uint *)&pObj->field_0x4 >> 3 & 0x1f) - iVar5;
              if ((iVar5 <= LutSize) && (pSSizes[0xb] <= iVar2)) {
                if (fDerive == 0) {
                  return 0xffffffff;
                }
                If_DsdManComputeFirst(p,pObj,&local_c8);
                uVar3 = If_DsdSign(p,pObj,SizeIn,iFirst + (&local_c8)[SizeIn],0);
                uVar4 = If_DsdSign(p,pObj,LimitOut,iFirst + (&local_c8)[LimitOut],0);
                uVar6 = If_DsdSign(p,pObj,i[0],iFirst + (&local_c8)[i[0]],0);
                uVar7 = If_DsdSign(p,pObj,i[1],iFirst + (&local_c8)[i[1]],0);
                uVar7 = uVar3 | uVar4 | uVar6 | uVar7;
                if ((uVar7 & uMaskNot) == 0) {
                  return uVar7;
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

unsigned If_DsdManCheckAndXor( If_DsdMan_t * p, int iFirst, unsigned uMaskNot, If_DsdObj_t * pObj, int nSuppAll, int LutSize, int fDerive, int fVerbose )
{
    int i[6], LimitOut, SizeIn, SizeOut, pSSizes[DAU_MAX_VAR];
    int nFans = If_DsdObjFaninNum(pObj), pFirsts[DAU_MAX_VAR];
    unsigned uRes;
    assert( pObj->nFans > 2 );
    assert( If_DsdObjSuppSize(pObj) > LutSize );
    If_DsdManGetSuppSizes( p, pObj, pSSizes );
    LimitOut = LutSize - (nSuppAll - pObj->nSupp + 1);
    assert( LimitOut < LutSize );
    for ( i[0] = 0;      i[0] < nFans; i[0]++ )
    for ( i[1] = i[0]+1; i[1] < nFans; i[1]++ )
    {
        SizeIn = pSSizes[i[0]] + pSSizes[i[1]];
        SizeOut = pObj->nSupp - SizeIn;
        if ( SizeIn > LutSize || SizeOut > LimitOut )
            continue;
        if ( !fDerive )
            return ~0;
        If_DsdManComputeFirst( p, pObj, pFirsts );
        uRes = If_DsdSign(p, pObj, i[0], iFirst + pFirsts[i[0]], 0) | 
               If_DsdSign(p, pObj, i[1], iFirst + pFirsts[i[1]], 0);
        if ( uRes & uMaskNot )
            continue;
        return uRes;
    }
    if ( pObj->nFans == 3 )
        return 0;
    for ( i[0] = 0;      i[0] < nFans; i[0]++ )
    for ( i[1] = i[0]+1; i[1] < nFans; i[1]++ )
    for ( i[2] = i[1]+1; i[2] < nFans; i[2]++ )
    {
        SizeIn = pSSizes[i[0]] + pSSizes[i[1]] + pSSizes[i[2]];
        SizeOut = pObj->nSupp - SizeIn;
        if ( SizeIn > LutSize || SizeOut > LimitOut )
            continue;
        if ( !fDerive )
            return ~0;
        If_DsdManComputeFirst( p, pObj, pFirsts );
        uRes = If_DsdSign(p, pObj, i[0], iFirst + pFirsts[i[0]], 0) | 
               If_DsdSign(p, pObj, i[1], iFirst + pFirsts[i[1]], 0) | 
               If_DsdSign(p, pObj, i[2], iFirst + pFirsts[i[2]], 0);
        if ( uRes & uMaskNot )
            continue;
        return uRes;
    }
    if ( pObj->nFans == 4 )
        return 0;
    for ( i[0] = 0;      i[0] < nFans; i[0]++ )
    for ( i[1] = i[0]+1; i[1] < nFans; i[1]++ )
    for ( i[2] = i[1]+1; i[2] < nFans; i[2]++ )
    for ( i[3] = i[2]+1; i[3] < nFans; i[3]++ )
    {
        SizeIn = pSSizes[i[0]] + pSSizes[i[1]] + pSSizes[i[2]] + pSSizes[i[3]];
        SizeOut = pObj->nSupp - SizeIn;
        if ( SizeIn > LutSize || SizeOut > LimitOut )
            continue;
        if ( !fDerive )
            return ~0;
        If_DsdManComputeFirst( p, pObj, pFirsts );
        uRes = If_DsdSign(p, pObj, i[0], iFirst + pFirsts[i[0]], 0) | 
               If_DsdSign(p, pObj, i[1], iFirst + pFirsts[i[1]], 0) | 
               If_DsdSign(p, pObj, i[2], iFirst + pFirsts[i[2]], 0) | 
               If_DsdSign(p, pObj, i[3], iFirst + pFirsts[i[3]], 0);
        if ( uRes & uMaskNot )
            continue;
        return uRes;
    }
    return 0;
}